

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManDupRemapCis(Gia_Man_t *pNew,Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  
  if (p->vCis->nSize != pNew->vCis->nSize) {
    __assert_fail("Vec_IntSize(p->vCis) == Vec_IntSize(pNew->vCis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x7f,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
  }
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    uVar5 = 0;
    uVar6 = 0;
    do {
      iVar1 = pVVar7->pArray[uVar6];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0069bc77:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar4 = p->pObjs + iVar1;
      uVar3 = *(undefined8 *)pGVar4;
      if (-1 < (int)uVar3) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      if (uVar6 != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff)) {
        __assert_fail("Gia_ObjCioId(pObj) == i",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                      ,0x82,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
      }
      uVar2 = pGVar4->Value;
      if ((int)uVar2 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      if (pNew->nObjs <= (int)(uVar2 >> 1)) goto LAB_0069bc77;
      pGVar4 = pNew->pObjs;
      pGVar8 = (Gia_Obj_t *)((ulong)(uVar2 & 1) ^ (ulong)(pGVar4 + (uVar2 >> 1)));
      if (((ulong)pGVar8 & 1) != 0) {
        __assert_fail("!Gia_IsComplement(pObjNew)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                      ,0x84,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
      }
      if ((pGVar8 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar8)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      if ((long)pNew->vCis->nSize <= (long)uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pNew->vCis->pArray[uVar6] = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555;
      if (-1 < (int)*(ulong *)pGVar8) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b9,"void Gia_ObjSetCioId(Gia_Obj_t *, int)");
      }
      *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xe0000000ffffffff | uVar5 & 0x1fffffff00000000;
      uVar6 = uVar6 + 1;
      pVVar7 = p->vCis;
      uVar5 = uVar5 + 0x100000000;
    } while ((long)uVar6 < (long)pVVar7->nSize);
  }
  return;
}

Assistant:

void Gia_ManDupRemapCis( Gia_Man_t * pNew, Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjNew;
    int i;
    assert( Vec_IntSize(p->vCis) == Vec_IntSize(pNew->vCis) );
    Gia_ManForEachCi( p, pObj, i )
    {
        assert( Gia_ObjCioId(pObj) == i );
        pObjNew = Gia_ObjFromLit( pNew, pObj->Value );
        assert( !Gia_IsComplement(pObjNew) );
        Vec_IntWriteEntry( pNew->vCis, i, Gia_ObjId(pNew, pObjNew) );
        Gia_ObjSetCioId( pObjNew, i );
    }
}